

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void miRegionOp(QRegionPrivate *dest,QRegionPrivate *reg1,QRegionPrivate *reg2,
               OverlapFunc overlapFunc,NonOverlapFunc nonOverlap1Func,NonOverlapFunc nonOverlap2Func
               )

{
  int iVar1;
  int iVar2;
  uint uVar3;
  QArrayData *pQVar4;
  int iVar5;
  Representation RVar6;
  Representation RVar7;
  Representation RVar8;
  int iVar9;
  pointer pQVar10;
  ulong uVar11;
  QRect *pQVar12;
  int iVar13;
  QRect *pQVar14;
  QRect *pQVar15;
  QRect *pQVar16;
  Representation *pRVar17;
  int iVar18;
  QRect *pQVar19;
  QRect *pQVar20;
  
  iVar9 = reg1->numRects;
  if ((long)iVar9 == 1) {
    pQVar15 = &reg1->extents;
  }
  else {
    pQVar15 = (reg1->rects).d.ptr;
  }
  iVar18 = reg2->numRects;
  if ((long)iVar18 == 1) {
    pQVar14 = &reg2->extents;
  }
  else {
    pQVar14 = (reg2->rects).d.ptr;
  }
  if (dest->numRects == 1) {
    if ((dest->rects).d.size == 0) {
      QList<QRect>::resize(&dest->rects,1);
    }
    pQVar10 = QList<QRect>::data(&dest->rects);
    RVar6.m_i = (dest->extents).y1.m_i;
    RVar7.m_i = (dest->extents).x2.m_i;
    RVar8.m_i = (dest->extents).y2.m_i;
    pQVar10->x1 = (Representation)(dest->extents).x1.m_i;
    pQVar10->y1 = (Representation)RVar6.m_i;
    pQVar10->x2 = (Representation)RVar7.m_i;
    pQVar10->y2 = (Representation)RVar8.m_i;
  }
  pQVar4 = &((dest->rects).d.d)->super_QArrayData;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar19 = pQVar15 + iVar9;
  pQVar12 = pQVar14 + iVar18;
  dest->numRects = 0;
  iVar9 = reg2->numRects;
  if (reg2->numRects < reg1->numRects) {
    iVar9 = reg1->numRects;
  }
  QList<QRect>::resize(&dest->rects,(long)(iVar9 * 2));
  iVar9 = (reg1->extents).y1.m_i;
  iVar18 = (reg2->extents).y1.m_i;
  if (iVar9 < iVar18) {
    iVar18 = iVar9;
  }
  iVar18 = iVar18 + -1;
  iVar9 = 0;
  do {
    pQVar16 = pQVar15;
    if (pQVar15 != pQVar19) {
      do {
        if ((pQVar16->y1).m_i != (pQVar15->y1).m_i) break;
        pQVar16 = pQVar16 + 1;
      } while (pQVar16 != pQVar19);
    }
    pQVar20 = pQVar14;
    if (pQVar14 != pQVar12) {
      do {
        if ((pQVar20->y1).m_i != (pQVar14->y1).m_i) break;
        pQVar20 = pQVar20 + 1;
      } while (pQVar20 != pQVar12);
    }
    iVar1 = dest->numRects;
    iVar13 = (pQVar15->y1).m_i;
    iVar2 = (pQVar14->y1).m_i;
    if (iVar13 < iVar2) {
      pRVar17 = &pQVar14->y1;
      iVar5 = iVar18 + 1;
      if (iVar18 + 1 < iVar13) {
        iVar5 = iVar13;
      }
      iVar18 = (pQVar15->y2).m_i;
      iVar13 = iVar2 + -1;
      if (iVar18 < iVar2 + -1) {
        iVar13 = iVar18;
      }
      if ((nonOverlap1Func != (NonOverlapFunc)0x0) && (iVar5 <= iVar13)) {
        (*nonOverlap1Func)(dest,pQVar15,pQVar16,iVar5,iVar13);
      }
LAB_00434cef:
      iVar13 = pRVar17->m_i;
    }
    else if (iVar2 < iVar13) {
      pRVar17 = &pQVar15->y1;
      iVar5 = iVar18 + 1;
      if (iVar18 + 1 < iVar2) {
        iVar5 = iVar2;
      }
      iVar18 = (pQVar14->y2).m_i;
      iVar2 = iVar13 + -1;
      if (iVar18 < iVar13 + -1) {
        iVar2 = iVar18;
      }
      if ((nonOverlap2Func != (NonOverlapFunc)0x0) && (iVar5 <= iVar2)) {
        (*nonOverlap2Func)(dest,pQVar14,pQVar20,iVar5,iVar2);
      }
      goto LAB_00434cef;
    }
    if (dest->numRects != iVar1) {
      iVar9 = miCoalesce(dest,iVar9,iVar1);
    }
    iVar1 = (pQVar15->y2).m_i;
    iVar18 = (pQVar14->y2).m_i;
    if (iVar1 < iVar18) {
      iVar18 = iVar1;
    }
    iVar1 = dest->numRects;
    if (iVar13 <= iVar18) {
      (*overlapFunc)(dest,pQVar15,pQVar16,pQVar14,pQVar20,iVar13,iVar18);
    }
    if (dest->numRects != iVar1) {
      iVar9 = miCoalesce(dest,iVar9,iVar1);
    }
    if ((pQVar15->y2).m_i == iVar18) {
      pQVar15 = pQVar16;
    }
    if ((pQVar14->y2).m_i == iVar18) {
      pQVar14 = pQVar20;
    }
    if ((pQVar15 == pQVar19) || (pQVar14 == pQVar12)) {
      iVar1 = dest->numRects;
      if (pQVar15 == pQVar19) {
        if ((nonOverlap2Func != (NonOverlapFunc)0x0) && (pQVar14 != pQVar12)) {
          do {
            pQVar15 = pQVar14;
            if (pQVar14 < pQVar12) {
              do {
                if ((pQVar15->y1).m_i != (pQVar14->y1).m_i) break;
                pQVar15 = pQVar15 + 1;
              } while (pQVar15 < pQVar12);
            }
            iVar2 = (pQVar14->y1).m_i;
            if (iVar2 <= iVar18 + 1) {
              iVar2 = iVar18 + 1;
            }
            (*nonOverlap2Func)(dest,pQVar14,pQVar15,iVar2,(pQVar14->y2).m_i);
            pQVar14 = pQVar15;
          } while (pQVar15 != pQVar12);
        }
      }
      else if (nonOverlap1Func != (NonOverlapFunc)0x0) {
        do {
          pQVar14 = pQVar15;
          if (pQVar15 < pQVar19) {
            do {
              if ((pQVar14->y1).m_i != (pQVar15->y1).m_i) break;
              pQVar14 = pQVar14 + 1;
            } while (pQVar14 < pQVar19);
          }
          iVar2 = (pQVar15->y1).m_i;
          if (iVar2 <= iVar18 + 1) {
            iVar2 = iVar18 + 1;
          }
          (*nonOverlap1Func)(dest,pQVar15,pQVar14,iVar2,(pQVar15->y2).m_i);
          pQVar15 = pQVar14;
        } while (pQVar14 != pQVar19);
      }
      if (dest->numRects != iVar1) {
        miCoalesce(dest,iVar9,iVar1);
      }
      uVar3 = dest->numRects;
      uVar11 = 4;
      if (4 < (int)uVar3) {
        uVar11 = (ulong)uVar3;
      }
      if (uVar11 < (ulong)(dest->rects).d.size >> 1) {
        QList<QRect>::resize(&dest->rects,(long)(int)uVar3);
      }
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,0x10,0x10);
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static void miRegionOp(QRegionPrivate &dest,
                       const QRegionPrivate *reg1, const QRegionPrivate *reg2,
                       OverlapFunc overlapFunc, NonOverlapFunc nonOverlap1Func,
                       NonOverlapFunc nonOverlap2Func)
{
    const QRect *r1;         // Pointer into first region
    const QRect *r2;         // Pointer into 2d region
    const QRect *r1End;               // End of 1st region
    const QRect *r2End;               // End of 2d region
    int ybot;          // Bottom of intersection
    int ytop;          // Top of intersection
    int prevBand;               // Index of start of previous band in dest
    int curBand;                // Index of start of current band in dest
    const QRect *r1BandEnd;  // End of current band in r1
    const QRect *r2BandEnd;  // End of current band in r2
    int top;                    // Top of non-overlapping band
    int bot;                    // Bottom of non-overlapping band

    /*
     * Initialization:
     *  set r1, r2, r1End and r2End appropriately, preserve the important
     * parts of the destination region until the end in case it's one of
     * the two source regions, then mark the "new" region empty, allocating
     * another array of rectangles for it to use.
     */
    if (reg1->numRects == 1)
        r1 = &reg1->extents;
    else
        r1 = reg1->rects.constData();
    if (reg2->numRects == 1)
        r2 = &reg2->extents;
    else
        r2 = reg2->rects.constData();

    r1End = r1 + reg1->numRects;
    r2End = r2 + reg2->numRects;

    dest.vectorize();

    /*
     * The following calls are going to detach dest.rects. Since dest might be
     * aliasing *reg1 and/or *reg2, and we could have active iterators on
     * reg1->rects and reg2->rects (if the regions have more than 1 rectangle),
     * take a copy of dest.rects to keep those iteractors valid.
     */
    const QList<QRect> destRectsCopy = dest.rects;
    Q_UNUSED(destRectsCopy);

    dest.numRects = 0;

    /*
     * Allocate a reasonable number of rectangles for the new region. The idea
     * is to allocate enough so the individual functions don't need to
     * reallocate and copy the array, which is time consuming, yet we don't
     * have to worry about using too much memory. I hope to be able to
     * nuke the realloc() at the end of this function eventually.
     */
    dest.rects.resize(qMax(reg1->numRects,reg2->numRects) * 2);

    /*
     * Initialize ybot and ytop.
     * In the upcoming loop, ybot and ytop serve different functions depending
     * on whether the band being handled is an overlapping or non-overlapping
     * band.
     *  In the case of a non-overlapping band (only one of the regions
     * has points in the band), ybot is the bottom of the most recent
     * intersection and thus clips the top of the rectangles in that band.
     * ytop is the top of the next intersection between the two regions and
     * serves to clip the bottom of the rectangles in the current band.
     *  For an overlapping band (where the two regions intersect), ytop clips
     * the top of the rectangles of both regions and ybot clips the bottoms.
     */
    if (reg1->extents.top() < reg2->extents.top())
        ybot = reg1->extents.top() - 1;
    else
        ybot = reg2->extents.top() - 1;

    /*
     * prevBand serves to mark the start of the previous band so rectangles
     * can be coalesced into larger rectangles. qv. miCoalesce, above.
     * In the beginning, there is no previous band, so prevBand == curBand
     * (curBand is set later on, of course, but the first band will always
     * start at index 0). prevBand and curBand must be indices because of
     * the possible expansion, and resultant moving, of the new region's
     * array of rectangles.
     */
    prevBand = 0;

    do {
        curBand = dest.numRects;

        /*
         * This algorithm proceeds one source-band (as opposed to a
         * destination band, which is determined by where the two regions
         * intersect) at a time. r1BandEnd and r2BandEnd serve to mark the
         * rectangle after the last one in the current band for their
         * respective regions.
         */
        r1BandEnd = r1;
        while (r1BandEnd != r1End && r1BandEnd->top() == r1->top())
            ++r1BandEnd;

        r2BandEnd = r2;
        while (r2BandEnd != r2End && r2BandEnd->top() == r2->top())
            ++r2BandEnd;

        /*
         * First handle the band that doesn't intersect, if any.
         *
         * Note that attention is restricted to one band in the
         * non-intersecting region at once, so if a region has n
         * bands between the current position and the next place it overlaps
         * the other, this entire loop will be passed through n times.
         */
        if (r1->top() < r2->top()) {
            top = qMax(r1->top(), ybot + 1);
            bot = qMin(r1->bottom(), r2->top() - 1);

            if (nonOverlap1Func != nullptr && bot >= top)
                (*nonOverlap1Func)(dest, r1, r1BandEnd, top, bot);
            ytop = r2->top();
        } else if (r2->top() < r1->top()) {
            top = qMax(r2->top(), ybot + 1);
            bot = qMin(r2->bottom(), r1->top() - 1);

            if (nonOverlap2Func != nullptr && bot >= top)
                (*nonOverlap2Func)(dest, r2, r2BandEnd, top, bot);
            ytop = r1->top();
        } else {
            ytop = r1->top();
        }

        /*
         * If any rectangles got added to the region, try and coalesce them
         * with rectangles from the previous band. Note we could just do
         * this test in miCoalesce, but some machines incur a not
         * inconsiderable cost for function calls, so...
         */
        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * Now see if we've hit an intersecting band. The two bands only
         * intersect if ybot >= ytop
         */
        ybot = qMin(r1->bottom(), r2->bottom());
        curBand = dest.numRects;
        if (ybot >= ytop)
            (*overlapFunc)(dest, r1, r1BandEnd, r2, r2BandEnd, ytop, ybot);

        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * If we've finished with a band (y2 == ybot) we skip forward
         * in the region to the next band.
         */
        if (r1->bottom() == ybot)
            r1 = r1BandEnd;
        if (r2->bottom() == ybot)
            r2 = r2BandEnd;
    } while (r1 != r1End && r2 != r2End);

    /*
     * Deal with whichever region still has rectangles left.
     */
    curBand = dest.numRects;
    if (r1 != r1End) {
        if (nonOverlap1Func != nullptr) {
            do {
                r1BandEnd = r1;
                while (r1BandEnd < r1End && r1BandEnd->top() == r1->top())
                    ++r1BandEnd;
                (*nonOverlap1Func)(dest, r1, r1BandEnd, qMax(r1->top(), ybot + 1), r1->bottom());
                r1 = r1BandEnd;
            } while (r1 != r1End);
        }
    } else if ((r2 != r2End) && (nonOverlap2Func != nullptr)) {
        do {
            r2BandEnd = r2;
            while (r2BandEnd < r2End && r2BandEnd->top() == r2->top())
                 ++r2BandEnd;
            (*nonOverlap2Func)(dest, r2, r2BandEnd, qMax(r2->top(), ybot + 1), r2->bottom());
            r2 = r2BandEnd;
        } while (r2 != r2End);
    }

    if (dest.numRects != curBand)
        (void)miCoalesce(dest, prevBand, curBand);

    /*
     * A bit of cleanup. To keep regions from growing without bound,
     * we shrink the array of rectangles to match the new number of
     * rectangles in the region.
     *
     * Only do this stuff if the number of rectangles allocated is more than
     * twice the number of rectangles in the region (a simple optimization).
     */
    if (qMax(4, dest.numRects) < (dest.rects.size() >> 1))
        dest.rects.resize(dest.numRects);
}